

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O0

void __thiscall deci::dictionary_t::Put(dictionary_t *this,value_t *key,value_t *value)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppVar3;
  value_t *pvVar4;
  value_t *local_58;
  value_t *local_50;
  pair<deci::value_t_*,_deci::value_t_*> local_48;
  _Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true> local_38;
  value_t *local_30;
  _Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true> local_28;
  iterator item;
  value_t *value_local;
  value_t *key_local;
  dictionary_t *this_local;
  
  local_30 = key;
  item.super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>._M_cur =
       (_Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>)
       (_Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>)value;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
       ::find(&this->storage,&local_30);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
       ::end(&this->storage);
  bVar1 = std::__detail::operator==(&local_28,&local_38);
  if (bVar1) {
    iVar2 = (*key->_vptr_value_t[2])();
    local_50 = (value_t *)CONCAT44(extraout_var,iVar2);
    local_58 = (value_t *)
               (**(code **)(*(long *)item.
                                     super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                                     ._M_cur + 0x10))();
    local_48 = std::make_pair<deci::value_t*,deci::value_t*>(&local_50,&local_58);
    std::
    unordered_map<deci::value_t*,deci::value_t*,deci::value_hash_t,deci::value_equal_to_t,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>>
    ::insert<std::pair<deci::value_t*,deci::value_t*>>
              ((unordered_map<deci::value_t*,deci::value_t*,deci::value_hash_t,deci::value_equal_to_t,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>>
                *)&this->storage,&local_48);
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::
             operator->((_Node_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>
                         *)&local_28);
    (*ppVar3->second->_vptr_value_t[3])();
    pvVar4 = (value_t *)
             (**(code **)(*(long *)item.
                                   super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                                   ._M_cur + 0x10))();
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::
             operator->((_Node_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>
                         *)&local_28);
    ppVar3->second = pvVar4;
  }
  return;
}

Assistant:

void dictionary_t::Put(const value_t& key, const value_t& value) {
    storage_t::iterator item = this->storage.find(const_cast<value_t*>(&key));
    if (item == this->storage.end())
    {
      this->storage.insert(std::make_pair(key.Copy(), value.Copy()));
    }
    else
    {
      item->second->Delete();
      item->second = value.Copy(); 
    }
  }